

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

point3f tinyusdz::transform(matrix4d *m,point3f *p)

{
  point3f pVar1;
  point3f local_50;
  point3f local_40;
  undefined1 local_34 [8];
  point3f tx;
  point3f *p_local;
  matrix4d *m_local;
  
  local_34._0_4_ = (undefined4)m->m[3][0];
  local_34._4_4_ = (undefined4)m->m[3][1];
  tx.x = (float)m->m[3][2];
  tx._4_8_ = p;
  pVar1 = value::MultV<tinyusdz::value::matrix4d,tinyusdz::value::point3f,double,float,3ul>(m,p);
  local_50.z = pVar1.z;
  local_40.z = local_50.z;
  local_50._0_8_ = pVar1._0_8_;
  local_40.x = local_50.x;
  local_40.y = local_50.y;
  pVar1 = operator+(&local_40,(point3f *)local_34);
  return pVar1;
}

Assistant:

value::point3f transform(const value::matrix4d &m, const value::point3f &p) {
  value::point3f tx{float(m.m[3][0]), float(m.m[3][1]), float(m.m[3][2])};
  return value::MultV<value::matrix4d, value::point3f, double, float, 3>(m, p) + tx;
}